

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O2

void idx2::DecodeTransformOrder(u64 Input,str Output)

{
  char cVar1;
  uint uVar2;
  
  for (; Input != 0; Input = Input >> 2) {
    uVar2 = (uint)Input & 3;
    cVar1 = (char)uVar2 + 'X';
    if (uVar2 == 3) {
      cVar1 = '+';
    }
    *Output = cVar1;
    Output = Output + 1;
  }
  *Output = '\0';
  return;
}

Assistant:

void
DecodeTransformOrder(u64 Input, str Output)
{
  int Len = 0;
  while (Input != 0)
  {
    int T = Input & 0x3;
    Output[Len++] = T == 3 ? '+' : char('X' + T);
    Input >>= 2;
  }
  Output[Len] = '\0';
}